

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

bool __thiscall
diligent_spirv_cross::Compiler::CombinedImageSamplerHandler::handle
          (CombinedImageSamplerHandler *this,Op opcode,uint32_t *args,uint32_t length)

{
  uint32_t chain;
  VariableID combined_module_id;
  SPIRFunction *caller;
  CombinedImageSampler *pCVar1;
  size_t sVar2;
  ID id;
  bool bVar3;
  ID id_00;
  ID id_01;
  uint32_t uVar4;
  ulong uVar5;
  SPIRVariable *pSVar6;
  SPIRType *pSVar7;
  CompilerError *this_00;
  _Elt_pointer ppSVar8;
  long lVar9;
  SPIRType *pSVar10;
  uint32_t *puVar11;
  long lVar12;
  CombinedImageSampler *pCVar13;
  VariableID image_id;
  CombinedImageSampler *pCVar14;
  Compiler *pCVar15;
  VariableID sampler_id;
  uint32_t local_50;
  ID local_4c;
  uint32_t type_id;
  uint32_t result_type;
  VariableID local_40;
  VariableID local_3c;
  ID local_38;
  int local_34;
  
  uVar5 = (ulong)(opcode - OpAccessChain);
  if (0x2a < opcode - OpAccessChain) {
LAB_002c8746:
    if (opcode != OpLoad) {
      return true;
    }
    if (length < 3) {
      return false;
    }
    result_type = *args;
    pSVar7 = get<diligent_spirv_cross::SPIRType>(this->compiler,result_type);
    if ((pSVar7->basetype != Sampler) && ((pSVar7->image).sampled != 1 || pSVar7->basetype != Image)
       ) {
      return true;
    }
LAB_002c862c:
    uVar4 = args[1];
    chain = args[2];
    type_id = CONCAT31(type_id._1_3_,1);
    set<diligent_spirv_cross::SPIRExpression,char_const(&)[1],unsigned_int&,bool>
              (this->compiler,uVar4,(char (*) [1])0x5da79c,&result_type,(bool *)&type_id);
    register_read(this->compiler,uVar4,chain,true);
    return true;
  }
  if ((0x6c040000000U >> (uVar5 & 0x3f) & 1) == 0) {
    if ((7UL >> (uVar5 & 0x3f) & 1) != 0) {
      if (length < 3) {
        return false;
      }
      result_type = *args;
      pSVar7 = get<diligent_spirv_cross::SPIRType>(this->compiler,result_type);
      if (pSVar7->basetype == Sampler) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (this_00,
                   "Attempting to use arrays or structs of separate samplers. This is not possible to statically remap to plain GLSL."
                  );
        goto LAB_002c8a97;
      }
      if (pSVar7->basetype != Image) {
        return true;
      }
      if ((pSVar7->image).sampled != 1) {
        return true;
      }
      goto LAB_002c862c;
    }
    if (uVar5 != 0x15) goto LAB_002c8746;
    bVar3 = false;
  }
  else {
    pSVar6 = maybe_get_backing_variable(this->compiler,args[2]);
    if (pSVar6 == (SPIRVariable *)0x0) {
      return true;
    }
    pSVar7 = get<diligent_spirv_cross::SPIRType>
                       (this->compiler,*(uint32_t *)&(pSVar6->super_IVariant).field_0xc);
    if (pSVar7->basetype != Image) {
      return true;
    }
    if ((pSVar7->image).sampled != 1) {
      return true;
    }
    if ((pSVar7->image).dim == Buffer) {
      return true;
    }
    bVar3 = true;
    if (this->compiler->dummy_sampler_id == 0) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,
                 "texelFetch without sampler was found, but no dummy sampler has been created with build_dummy_sampler_for_combined_images()."
                );
LAB_002c8a97:
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  ppSVar8 = (this->functions).c.
            super__Deque_base<diligent_spirv_cross::SPIRFunction_*,_std::allocator<diligent_spirv_cross::SPIRFunction_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppSVar8 !=
      (this->functions).c.
      super__Deque_base<diligent_spirv_cross::SPIRFunction_*,_std::allocator<diligent_spirv_cross::SPIRFunction_*>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    if (ppSVar8 ==
        (this->functions).c.
        super__Deque_base<diligent_spirv_cross::SPIRFunction_*,_std::allocator<diligent_spirv_cross::SPIRFunction_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppSVar8 = (this->functions).c.
                super__Deque_base<diligent_spirv_cross::SPIRFunction_*,_std::allocator<diligent_spirv_cross::SPIRFunction_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    caller = ppSVar8[-1];
    if (caller->do_combined_parameters == true) {
      image_id.id = args[2];
      pSVar6 = maybe_get_backing_variable(this->compiler,image_id.id);
      if (pSVar6 != (SPIRVariable *)0x0) {
        image_id.id = (pSVar6->super_IVariant).self.id;
      }
      puVar11 = args + 3;
      if (bVar3) {
        puVar11 = &this->compiler->dummy_sampler_id;
      }
      sampler_id.id = *puVar11;
      pSVar6 = maybe_get_backing_variable(this->compiler,sampler_id.id);
      if (pSVar6 != (SPIRVariable *)0x0) {
        sampler_id.id = (pSVar6->super_IVariant).self.id;
      }
      combined_module_id.id = args[1];
      pSVar7 = get<diligent_spirv_cross::SPIRType>(this->compiler,*args);
      register_combined_image_sampler
                (this,caller,combined_module_id,image_id,sampler_id,(pSVar7->image).depth);
    }
  }
  id_00.id = remap_parameter(this,args[2]);
  if (bVar3) {
    pCVar15 = this->compiler;
    id_01.id = pCVar15->dummy_sampler_id;
  }
  else {
    id_01.id = remap_parameter(this,args[3]);
    pCVar15 = this->compiler;
  }
  pCVar1 = (pCVar15->combined_image_samplers).
           super_VectorView<diligent_spirv_cross::CombinedImageSampler>.ptr;
  sVar2 = (pCVar15->combined_image_samplers).
          super_VectorView<diligent_spirv_cross::CombinedImageSampler>.buffer_size;
  lVar9 = sVar2 * 0xc;
  pCVar14 = pCVar1 + 2;
  for (lVar12 = (long)sVar2 >> 2; 0 < lVar12; lVar12 = lVar12 + -1) {
    if ((pCVar14[-2].image_id.id == id_00.id) && (pCVar14[-2].sampler_id.id == id_01.id)) {
      pCVar13 = pCVar14 + -2;
      goto LAB_002c8852;
    }
    if ((pCVar14[-1].image_id.id == id_00.id) && (pCVar14[-1].sampler_id.id == id_01.id)) {
      pCVar13 = pCVar14 + -1;
      goto LAB_002c8852;
    }
    if (((pCVar14->image_id).id == id_00.id) &&
       (pCVar13 = pCVar14, (pCVar14->sampler_id).id == id_01.id)) goto LAB_002c8852;
    if ((pCVar14[1].image_id.id == id_00.id) && (pCVar14[1].sampler_id.id == id_01.id)) {
      pCVar13 = pCVar14 + 1;
      goto LAB_002c8852;
    }
    pCVar14 = pCVar14 + 4;
    lVar9 = lVar9 + -0x30;
  }
  lVar9 = lVar9 / 0xc;
  pCVar13 = pCVar14 + -2;
  if (lVar9 == 1) {
LAB_002c8a65:
    if (((pCVar13->image_id).id != id_00.id) || ((pCVar13->sampler_id).id != id_01.id))
    goto LAB_002c885b;
  }
  else if (lVar9 == 3) {
    if ((pCVar14[-2].image_id.id != id_00.id) || (pCVar14[-2].sampler_id.id != id_01.id)) {
      pCVar13 = pCVar14 + -1;
      goto LAB_002c8a52;
    }
  }
  else {
    if (lVar9 != 2) goto LAB_002c885b;
LAB_002c8a52:
    if (((pCVar13->image_id).id != id_00.id) || ((pCVar13->sampler_id).id != id_01.id)) {
      pCVar13 = pCVar13 + 1;
      goto LAB_002c8a65;
    }
  }
LAB_002c8852:
  if (pCVar13 != pCVar1 + sVar2) {
    return true;
  }
LAB_002c885b:
  if (bVar3) {
    local_50 = ParsedIR::increase_bound_by(&pCVar15->ir,1);
    result_type = 0x1b;
    pSVar7 = set<diligent_spirv_cross::SPIRType,spv::Op>(this->compiler,local_50,&result_type);
    pSVar10 = expression_type(this->compiler,args[2]);
    SPIRType::operator=(pSVar7,pSVar10);
    (pSVar7->super_IVariant).self.id = local_50;
    pSVar7->basetype = SampledImage;
    (pSVar7->image).depth = false;
    local_4c.id = 0;
  }
  else {
    local_50 = *args;
    local_4c.id = args[1];
  }
  uVar4 = ParsedIR::increase_bound_by(&this->compiler->ir,2);
  local_38.id = uVar4 + 1;
  result_type = 0x20;
  type_id = uVar4;
  pSVar7 = set<diligent_spirv_cross::SPIRType,spv::Op>(this->compiler,uVar4,&result_type);
  pSVar10 = get<diligent_spirv_cross::SPIRType>(this->compiler,local_50);
  SPIRType::operator=(pSVar7,pSVar10);
  id.id = local_38.id;
  pSVar7->pointer = true;
  pSVar7->storage = StorageClassUniformConstant;
  (pSVar7->parent_type).id = uVar4;
  result_type = 0;
  local_34 = 0;
  set<diligent_spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,int>
            (this->compiler,local_38.id,&type_id,&result_type,&local_34);
  if ((((id_01.id != 0) &&
       (bVar3 = ParsedIR::has_decoration(&this->compiler->ir,id_01,DecorationRelaxedPrecision),
       bVar3)) ||
      ((id_00.id != 0 &&
       (bVar3 = ParsedIR::has_decoration(&this->compiler->ir,id_00,DecorationRelaxedPrecision),
       bVar3)))) ||
     ((local_4c.id != 0 &&
      (bVar3 = ParsedIR::has_decoration(&this->compiler->ir,local_4c,DecorationRelaxedPrecision),
      bVar3)))) {
    ParsedIR::set_decoration(&this->compiler->ir,id,DecorationRelaxedPrecision,0);
  }
  pSVar6 = maybe_get_backing_variable(this->compiler,id_00.id);
  if (pSVar6 != (SPIRVariable *)0x0) {
    pSVar10 = get<diligent_spirv_cross::SPIRType>
                        (this->compiler,*(uint32_t *)&(pSVar6->super_IVariant).field_0xc);
    SmallVector<unsigned_int,_8UL>::operator=(&pSVar7->array,&pSVar10->array);
    SmallVector<bool,_8UL>::operator=(&pSVar7->array_size_literal,&pSVar10->array_size_literal);
  }
  result_type = id.id;
  local_40.id = id_00.id;
  local_3c.id = id_01.id;
  SmallVector<diligent_spirv_cross::CombinedImageSampler,_8UL>::push_back
            (&this->compiler->combined_image_samplers,(CombinedImageSampler *)&result_type);
  return true;
}

Assistant:

bool Compiler::CombinedImageSamplerHandler::handle(Op opcode, const uint32_t *args, uint32_t length)
{
	// We need to figure out where samplers and images are loaded from, so do only the bare bones compilation we need.
	bool is_fetch = false;

	switch (opcode)
	{
	case OpLoad:
	{
		if (length < 3)
			return false;

		uint32_t result_type = args[0];

		auto &type = compiler.get<SPIRType>(result_type);
		bool separate_image = type.basetype == SPIRType::Image && type.image.sampled == 1;
		bool separate_sampler = type.basetype == SPIRType::Sampler;

		// If not separate image or sampler, don't bother.
		if (!separate_image && !separate_sampler)
			return true;

		uint32_t id = args[1];
		uint32_t ptr = args[2];
		compiler.set<SPIRExpression>(id, "", result_type, true);
		compiler.register_read(id, ptr, true);
		return true;
	}

	case OpInBoundsAccessChain:
	case OpAccessChain:
	case OpPtrAccessChain:
	{
		if (length < 3)
			return false;

		// Technically, it is possible to have arrays of textures and arrays of samplers and combine them, but this becomes essentially
		// impossible to implement, since we don't know which concrete sampler we are accessing.
		// One potential way is to create a combinatorial explosion where N textures and M samplers are combined into N * M sampler2Ds,
		// but this seems ridiculously complicated for a problem which is easy to work around.
		// Checking access chains like this assumes we don't have samplers or textures inside uniform structs, but this makes no sense.

		uint32_t result_type = args[0];

		auto &type = compiler.get<SPIRType>(result_type);
		bool separate_image = type.basetype == SPIRType::Image && type.image.sampled == 1;
		bool separate_sampler = type.basetype == SPIRType::Sampler;
		if (separate_sampler)
			SPIRV_CROSS_THROW(
			    "Attempting to use arrays or structs of separate samplers. This is not possible to statically "
			    "remap to plain GLSL.");

		if (separate_image)
		{
			uint32_t id = args[1];
			uint32_t ptr = args[2];
			compiler.set<SPIRExpression>(id, "", result_type, true);
			compiler.register_read(id, ptr, true);
		}
		return true;
	}

	case OpImageFetch:
	case OpImageQuerySizeLod:
	case OpImageQuerySize:
	case OpImageQueryLevels:
	case OpImageQuerySamples:
	{
		// If we are fetching from a plain OpTypeImage or querying LOD, we must pre-combine with our dummy sampler.
		auto *var = compiler.maybe_get_backing_variable(args[2]);
		if (!var)
			return true;

		auto &type = compiler.get<SPIRType>(var->basetype);
		if (type.basetype == SPIRType::Image && type.image.sampled == 1 && type.image.dim != DimBuffer)
		{
			if (compiler.dummy_sampler_id == 0)
				SPIRV_CROSS_THROW("texelFetch without sampler was found, but no dummy sampler has been created with "
				                  "build_dummy_sampler_for_combined_images().");

			// Do it outside.
			is_fetch = true;
			break;
		}

		return true;
	}

	case OpSampledImage:
		// Do it outside.
		break;

	default:
		return true;
	}

	// Registers sampler2D calls used in case they are parameters so
	// that their callees know which combined image samplers to propagate down the call stack.
	if (!functions.empty())
	{
		auto &callee = *functions.top();
		if (callee.do_combined_parameters)
		{
			uint32_t image_id = args[2];

			auto *image = compiler.maybe_get_backing_variable(image_id);
			if (image)
				image_id = image->self;

			uint32_t sampler_id = is_fetch ? compiler.dummy_sampler_id : args[3];
			auto *sampler = compiler.maybe_get_backing_variable(sampler_id);
			if (sampler)
				sampler_id = sampler->self;

			uint32_t combined_id = args[1];

			auto &combined_type = compiler.get<SPIRType>(args[0]);
			register_combined_image_sampler(callee, combined_id, image_id, sampler_id, combined_type.image.depth);
		}
	}

	// For function calls, we need to remap IDs which are function parameters into global variables.
	// This information is statically known from the current place in the call stack.
	// Function parameters are not necessarily pointers, so if we don't have a backing variable, remapping will know
	// which backing variable the image/sample came from.
	VariableID image_id = remap_parameter(args[2]);
	VariableID sampler_id = is_fetch ? compiler.dummy_sampler_id : remap_parameter(args[3]);

	auto itr = find_if(begin(compiler.combined_image_samplers), end(compiler.combined_image_samplers),
	                   [image_id, sampler_id](const CombinedImageSampler &combined) {
		                   return combined.image_id == image_id && combined.sampler_id == sampler_id;
	                   });

	if (itr == end(compiler.combined_image_samplers))
	{
		uint32_t sampled_type;
		uint32_t combined_module_id;
		if (is_fetch)
		{
			// Have to invent the sampled image type.
			sampled_type = compiler.ir.increase_bound_by(1);
			auto &type = compiler.set<SPIRType>(sampled_type, OpTypeSampledImage);
			type = compiler.expression_type(args[2]);
			type.self = sampled_type;
			type.basetype = SPIRType::SampledImage;
			type.image.depth = false;
			combined_module_id = 0;
		}
		else
		{
			sampled_type = args[0];
			combined_module_id = args[1];
		}

		auto id = compiler.ir.increase_bound_by(2);
		auto type_id = id + 0;
		auto combined_id = id + 1;

		// Make a new type, pointer to OpTypeSampledImage, so we can make a variable of this type.
		// We will probably have this type lying around, but it doesn't hurt to make duplicates for internal purposes.
		auto &type = compiler.set<SPIRType>(type_id, OpTypePointer);
		auto &base = compiler.get<SPIRType>(sampled_type);
		type = base;
		type.pointer = true;
		type.storage = StorageClassUniformConstant;
		type.parent_type = type_id;

		// Build new variable.
		compiler.set<SPIRVariable>(combined_id, type_id, StorageClassUniformConstant, 0);

		// Inherit RelaxedPrecision (and potentially other useful flags if deemed relevant).
		// If any of OpSampledImage, underlying image or sampler are marked, inherit the decoration.
		bool relaxed_precision =
		    (sampler_id && compiler.has_decoration(sampler_id, DecorationRelaxedPrecision)) ||
		    (image_id && compiler.has_decoration(image_id, DecorationRelaxedPrecision)) ||
		    (combined_module_id && compiler.has_decoration(combined_module_id, DecorationRelaxedPrecision));

		if (relaxed_precision)
			compiler.set_decoration(combined_id, DecorationRelaxedPrecision);

		// Propagate the array type for the original image as well.
		auto *var = compiler.maybe_get_backing_variable(image_id);
		if (var)
		{
			auto &parent_type = compiler.get<SPIRType>(var->basetype);
			type.array = parent_type.array;
			type.array_size_literal = parent_type.array_size_literal;
		}

		compiler.combined_image_samplers.push_back({ combined_id, image_id, sampler_id });
	}

	return true;
}